

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
::ReadColumnSizes<false>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
           *this)

{
  int iVar1;
  int i;
  int iVar2;
  int num_sizes;
  int local_14;
  
  iVar2 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars + -1;
  iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (iVar1 != iVar2) {
    BinaryReaderBase::ReportError<int>
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x12d049,&local_14);
  }
  local_14 = iVar2;
  for (iVar1 = 0; iVar1 < local_14; iVar1 = iVar1 + 1) {
    BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}